

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O0

bool __thiscall TCLAP::SwitchArg::combinedSwitchesMatch(SwitchArg *this,string *combinedSwitches)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong in_RSI;
  long in_RDI;
  bool bVar8;
  uint i;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_d8 [36];
  uint local_b4;
  string local_b0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60 [39];
  byte local_39;
  string local_38 [32];
  ulong local_18;
  
  local_18 = in_RSI;
  lVar4 = std::__cxx11::string::length();
  local_39 = 0;
  bVar8 = false;
  if (lVar4 != 0) {
    pcVar5 = (char *)std::__cxx11::string::operator[](local_18);
    cVar3 = *pcVar5;
    Arg::flagStartString_abi_cxx11_();
    local_39 = 1;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    bVar8 = cVar3 != *pcVar5;
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string(local_38);
  }
  uVar6 = local_18;
  if (!bVar8) {
    __lhs = &local_80;
    Arg::nameStartString_abi_cxx11_();
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_60,uVar6);
    Arg::nameStartString_abi_cxx11_();
    bVar2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string((string *)&local_80);
    uVar6 = local_18;
    if ((bVar2 & 1) == 0) {
      cVar3 = Arg::delimiter();
      lVar4 = std::__cxx11::string::find_first_of((char)uVar6,(ulong)(uint)(int)cVar3);
      if (lVar4 == -1) {
        for (local_b4 = 1; uVar6 = (ulong)local_b4, uVar7 = std::__cxx11::string::length(),
            uVar6 < uVar7; local_b4 = local_b4 + 1) {
          lVar4 = std::__cxx11::string::length();
          bVar1 = false;
          bVar8 = false;
          if (lVar4 != 0) {
            pcVar5 = (char *)std::__cxx11::string::operator[](local_18);
            cVar3 = *pcVar5;
            pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI + 8);
            bVar8 = false;
            if (cVar3 == *pcVar5) {
              pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI + 8);
              cVar3 = *pcVar5;
              Arg::flagStartString_abi_cxx11_();
              bVar1 = true;
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_d8);
              bVar8 = cVar3 != *pcVar5;
            }
          }
          if (bVar1) {
            std::__cxx11::string::~string(local_d8);
          }
          if (bVar8) {
            cVar3 = Arg::blankChar();
            pcVar5 = (char *)std::__cxx11::string::operator[](local_18);
            *pcVar5 = cVar3;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool SwitchArg::combinedSwitchesMatch(std::string& combinedSwitches )
{
	// make sure this is actually a combined switch
	if ( combinedSwitches.length() > 0 &&
	     combinedSwitches[0] != Arg::flagStartString()[0] )
		return false;

	// make sure it isn't a long name 
	if ( combinedSwitches.substr( 0, Arg::nameStartString().length() ) == 
	     Arg::nameStartString() )
		return false;

	// make sure the delimiter isn't in the string 
	if ( combinedSwitches.find_first_of( Arg::delimiter() ) != std::string::npos )
		return false;

	// ok, we're not specifying a ValueArg, so we know that we have
	// a combined switch list.  
	for ( unsigned int i = 1; i < combinedSwitches.length(); i++ )
		if ( _flag.length() > 0 && 
		     combinedSwitches[i] == _flag[0] &&
		     _flag[0] != Arg::flagStartString()[0] ) 
		{
			// update the combined switches so this one is no longer present
			// this is necessary so that no unlabeled args are matched
			// later in the processing.
			//combinedSwitches.erase(i,1);
			combinedSwitches[i] = Arg::blankChar(); 
			return true;
		}

	// none of the switches passed in the list match. 
	return false;	
}